

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O3

void __thiscall
Importer_rangeOfValidSituations_Test::TestBody(Importer_rangeOfValidSituations_Test *this)

{
  string *psVar1;
  shared_ptr *psVar2;
  char cVar3;
  long *plVar4;
  long *plVar5;
  char *pcVar6;
  AssertionResult gtest_ar_;
  string funkyString;
  ValidatorPtr validator;
  ModelPtr flattenedFunkyModel;
  ParserPtr parser;
  ModelPtr funkyModel;
  ImporterPtr importer;
  ModelPtr importedComponents;
  ModelPtr importedUnits;
  ModelPtr localConcreteUnits;
  ModelPtr concreteComponents;
  ModelPtr concreteUnits;
  AssertionResult local_138;
  long local_128;
  long lStack_120;
  AssertionResult local_118;
  long local_108;
  long lStack_100;
  long *local_f8;
  shared_ptr *local_f0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  long local_e0 [2];
  string *local_d0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c8;
  unsigned_long local_c0;
  undefined1 local_b8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b0;
  long *local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  long local_98 [2];
  shared_ptr *local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  string local_78 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  string local_68 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  shared_ptr *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  string local_48 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  string local_38 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  
  libcellml::Parser::create(SUB81(local_b8,0));
  local_138._0_8_ = &local_128;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_138,"importer/units_concrete.cellml","");
  fileContents((string *)&local_118);
  libcellml::Parser::parseModel(local_38);
  if ((long *)local_118._0_8_ != &local_108) {
    operator_delete((void *)local_118._0_8_,local_108 + 1);
  }
  if ((long *)local_138._0_8_ != &local_128) {
    operator_delete((void *)local_138._0_8_,local_128 + 1);
  }
  local_138._0_8_ = (long *)0x0;
  local_f0 = (shared_ptr *)libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_118,"size_t(0)","parser->issueCount()",(unsigned_long *)&local_138,
             (unsigned_long *)&local_f0);
  if ((string)local_118.success_ == (string)0x0) {
    testing::Message::Message((Message *)&local_138);
    if (local_118.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_118.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x1d5,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f0,(Message *)&local_138);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f0);
    if ((long *)local_138._0_8_ != (long *)0x0) {
      cVar3 = testing::internal::IsTrue(true);
      if ((cVar3 != '\0') && ((long *)local_138._0_8_ != (long *)0x0)) {
        (**(code **)(*(long *)local_138._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_118.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  local_138._0_8_ = &local_128;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_138,"importer/components_concrete.cellml","");
  fileContents((string *)&local_118);
  libcellml::Parser::parseModel(local_48);
  if ((long *)local_118._0_8_ != &local_108) {
    operator_delete((void *)local_118._0_8_,local_108 + 1);
  }
  if ((long *)local_138._0_8_ != &local_128) {
    operator_delete((void *)local_138._0_8_,local_128 + 1);
  }
  local_138._0_8_ = (long *)0x0;
  local_f0 = (shared_ptr *)libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_118,"size_t(0)","parser->issueCount()",(unsigned_long *)&local_138,
             (unsigned_long *)&local_f0);
  if ((string)local_118.success_ == (string)0x0) {
    testing::Message::Message((Message *)&local_138);
    if (local_118.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_118.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x1d8,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f0,(Message *)&local_138);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f0);
    if ((long *)local_138._0_8_ != (long *)0x0) {
      cVar3 = testing::internal::IsTrue(true);
      if ((cVar3 != '\0') && ((long *)local_138._0_8_ != (long *)0x0)) {
        (**(code **)(*(long *)local_138._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_118.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  local_138._0_8_ = &local_128;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_138,"importer/units_imported.cellml","");
  fileContents((string *)&local_118);
  libcellml::Parser::parseModel(local_68);
  if ((long *)local_118._0_8_ != &local_108) {
    operator_delete((void *)local_118._0_8_,local_108 + 1);
  }
  if ((long *)local_138._0_8_ != &local_128) {
    operator_delete((void *)local_138._0_8_,local_128 + 1);
  }
  local_138._0_8_ = (long *)0x0;
  local_f0 = (shared_ptr *)libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_118,"size_t(0)","parser->issueCount()",(unsigned_long *)&local_138,
             (unsigned_long *)&local_f0);
  if ((string)local_118.success_ == (string)0x0) {
    testing::Message::Message((Message *)&local_138);
    if (local_118.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_118.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x1de,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f0,(Message *)&local_138);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f0);
    if ((long *)local_138._0_8_ != (long *)0x0) {
      cVar3 = testing::internal::IsTrue(true);
      if ((cVar3 != '\0') && ((long *)local_138._0_8_ != (long *)0x0)) {
        (**(code **)(*(long *)local_138._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_118.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  local_138._0_8_ = &local_128;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_138,"importer/components_imported.cellml","");
  fileContents((string *)&local_118);
  libcellml::Parser::parseModel(local_78);
  if ((long *)local_118._0_8_ != &local_108) {
    operator_delete((void *)local_118._0_8_,local_108 + 1);
  }
  if ((long *)local_138._0_8_ != &local_128) {
    operator_delete((void *)local_138._0_8_,local_128 + 1);
  }
  local_138._0_8_ = (long *)0x0;
  local_f0 = (shared_ptr *)libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_118,"size_t(0)","parser->issueCount()",(unsigned_long *)&local_138,
             (unsigned_long *)&local_f0);
  if ((string)local_118.success_ == (string)0x0) {
    testing::Message::Message((Message *)&local_138);
    if (local_118.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_118.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x1e1,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f0,(Message *)&local_138);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f0);
    if ((long *)local_138._0_8_ != (long *)0x0) {
      cVar3 = testing::internal::IsTrue(true);
      if ((cVar3 != '\0') && ((long *)local_138._0_8_ != (long *)0x0)) {
        (**(code **)(*(long *)local_138._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_118.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  local_118._0_8_ = &local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"localConcreteUnits","");
  libcellml::Model::create((string *)&local_58);
  if ((long *)local_118._0_8_ != &local_108) {
    operator_delete((void *)local_118._0_8_,local_108 + 1);
  }
  local_118._0_8_ = &local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"units5","");
  libcellml::Units::create((string *)&local_138);
  libcellml::Model::addUnits(local_58);
  if (local_138.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138.message_.ptr_);
  }
  if ((long *)local_118._0_8_ != &local_108) {
    operator_delete((void *)local_118._0_8_,local_108 + 1);
  }
  libcellml::Importer::create(SUB81(&local_88,0));
  psVar2 = local_88;
  local_118._0_8_ = &local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"i_dont_exist_yet.cellml","")
  ;
  libcellml::Importer::addModel(psVar2,local_38);
  if ((long *)local_118._0_8_ != &local_108) {
    operator_delete((void *)local_118._0_8_,local_108 + 1);
  }
  psVar2 = local_88;
  local_118._0_8_ = &local_108;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_118,"https://www.example.com/myComponents.cellml","");
  libcellml::Importer::addModel(psVar2,local_48);
  if ((long *)local_118._0_8_ != &local_108) {
    operator_delete((void *)local_118._0_8_,local_108 + 1);
  }
  psVar2 = local_88;
  local_138._0_8_ = &local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"importer/","");
  resourcePath((string *)&local_118);
  libcellml::Importer::resolveImports(psVar2,local_68);
  if ((long *)local_118._0_8_ != &local_108) {
    operator_delete((void *)local_118._0_8_,local_108 + 1);
  }
  if ((long *)local_138._0_8_ != &local_128) {
    operator_delete((void *)local_138._0_8_,local_128 + 1);
  }
  psVar2 = local_88;
  local_138._0_8_ = &local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"importer/","");
  resourcePath((string *)&local_118);
  libcellml::Importer::resolveImports(psVar2,local_78);
  if ((long *)local_118._0_8_ != &local_108) {
    operator_delete((void *)local_118._0_8_,local_108 + 1);
  }
  if ((long *)local_138._0_8_ != &local_128) {
    operator_delete((void *)local_138._0_8_,local_128 + 1);
  }
  cVar3 = libcellml::Model::hasUnresolvedImports();
  local_138._0_8_ = CONCAT71(local_138._1_7_,cVar3) ^ 1;
  local_138.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (cVar3 != '\0') {
    testing::Message::Message((Message *)&local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_118,&local_138.success_,"importedUnits->hasUnresolvedImports()","true");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x1f1,(char *)local_118._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    if ((long *)local_118._0_8_ != &local_108) {
      operator_delete((void *)local_118._0_8_,local_108 + 1);
    }
    if (local_f0 != (shared_ptr *)0x0) {
      cVar3 = testing::internal::IsTrue(true);
      if ((cVar3 != '\0') && (local_f0 != (shared_ptr *)0x0)) {
        (**(code **)(*(long *)local_f0 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_138.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  cVar3 = libcellml::Model::hasUnresolvedImports();
  local_138._0_8_ = CONCAT71(local_138._1_7_,cVar3) ^ 1;
  local_138.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (cVar3 != '\0') {
    testing::Message::Message((Message *)&local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_118,&local_138.success_,"importedComponents->hasUnresolvedImports()","true");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x1f2,(char *)local_118._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    if ((long *)local_118._0_8_ != &local_108) {
      operator_delete((void *)local_118._0_8_,local_108 + 1);
    }
    if (local_f0 != (shared_ptr *)0x0) {
      cVar3 = testing::internal::IsTrue(true);
      if ((cVar3 != '\0') && (local_f0 != (shared_ptr *)0x0)) {
        (**(code **)(*(long *)local_f0 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_138.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  local_a8 = local_98;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,"importer/components_source.cellml","");
  resourcePath((string *)&local_f0);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,0x15c832);
  plVar5 = plVar4 + 2;
  if ((long *)*plVar4 == plVar5) {
    local_128 = *plVar5;
    lStack_120 = plVar4[3];
    local_138._0_8_ = &local_128;
  }
  else {
    local_128 = *plVar5;
    local_138._0_8_ = (long *)*plVar4;
  }
  local_138.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append(&local_138.success_);
  plVar5 = plVar4 + 2;
  if ((long *)*plVar4 == plVar5) {
    local_108 = *plVar5;
    lStack_100 = plVar4[3];
    local_118._0_8_ = &local_108;
  }
  else {
    local_108 = *plVar5;
    local_118._0_8_ = (long *)*plVar4;
  }
  local_118.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((long *)local_138._0_8_ != &local_128) {
    operator_delete((void *)local_138._0_8_,local_128 + 1);
  }
  if (local_f0 != (shared_ptr *)local_e0) {
    operator_delete(local_f0,local_e0[0] + 1);
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8,local_98[0] + 1);
  }
  libcellml::Parser::parseModel((string *)&local_a8);
  local_f0 = (shared_ptr *)0x0;
  local_d0 = (string *)libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_138,"size_t(0)","parser->issueCount()",(unsigned_long *)&local_f0,
             (unsigned_long *)&local_d0);
  if ((Message)local_138.success_ == (Message)0x0) {
    testing::Message::Message((Message *)&local_f0);
    if (local_138.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_138.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x212,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d0,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d0);
    if (local_f0 != (shared_ptr *)0x0) {
      cVar3 = testing::internal::IsTrue(true);
      if ((cVar3 != '\0') && (local_f0 != (shared_ptr *)0x0)) {
        (**(code **)(*(long *)local_f0 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_138.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  local_f0 = (shared_ptr *)local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"importer/","");
  resourcePath((string *)&local_138);
  libcellml::Importer::resolveImports(local_88,(string *)&local_a8);
  if ((long *)local_138._0_8_ != &local_128) {
    operator_delete((void *)local_138._0_8_,local_128 + 1);
  }
  if (local_f0 != (shared_ptr *)local_e0) {
    operator_delete(local_f0,local_e0[0] + 1);
  }
  cVar3 = libcellml::Model::hasUnresolvedImports();
  local_f0 = (shared_ptr *)(CONCAT71(local_f0._1_7_,cVar3) ^ 1);
  local_e8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar3 != '\0') {
    testing::Message::Message((Message *)&local_d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_138,(char *)&local_f0,"funkyModel->hasUnresolvedImports()","true");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x217,(char *)local_138._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f8);
    if ((long *)local_138._0_8_ != &local_128) {
      operator_delete((void *)local_138._0_8_,local_128 + 1);
    }
    if (local_d0 != (string *)0x0) {
      cVar3 = testing::internal::IsTrue(true);
      if ((cVar3 != '\0') && (local_d0 != (string *)0x0)) {
        (**(code **)(*(long *)local_d0 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_e8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_f0 = (shared_ptr *)0x0;
  local_d0 = (string *)libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_138,"size_t(0)","importer->issueCount()",(unsigned_long *)&local_f0,
             (unsigned_long *)&local_d0);
  if ((Message)local_138.success_ == (Message)0x0) {
    testing::Message::Message((Message *)&local_f0);
    if (local_138.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_138.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x218,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d0,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d0);
    if (local_f0 != (shared_ptr *)0x0) {
      cVar3 = testing::internal::IsTrue(true);
      if ((cVar3 != '\0') && (local_f0 != (shared_ptr *)0x0)) {
        (**(code **)(*(long *)local_f0 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_138.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  libcellml::Validator::create();
  libcellml::Validator::validateModel(local_f0);
  local_d0 = (string *)0x0;
  local_f8 = (long *)libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_138,"size_t(0)","validator->issueCount()",(unsigned_long *)&local_d0
             ,(unsigned_long *)&local_f8);
  if ((Message)local_138.success_ == (Message)0x0) {
    testing::Message::Message((Message *)&local_d0);
    if (local_138.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_138.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x21d,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f8);
    if (local_d0 != (string *)0x0) {
      cVar3 = testing::internal::IsTrue(true);
      if ((cVar3 != '\0') && (local_d0 != (string *)0x0)) {
        (**(code **)(*(long *)local_d0 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_138.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  libcellml::Importer::flattenModel((shared_ptr *)&local_d0);
  local_f8 = (long *)0x0;
  local_c0 = libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_138,"size_t(0)","importer->issueCount()",(unsigned_long *)&local_f8,
             &local_c0);
  if ((Message)local_138.success_ == (Message)0x0) {
    testing::Message::Message((Message *)&local_f8);
    if (local_138.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_138.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x221,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c0,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c0);
    if (local_f8 != (long *)0x0) {
      cVar3 = testing::internal::IsTrue(true);
      if ((cVar3 != '\0') && (local_f8 != (long *)0x0)) {
        (**(code **)(*local_f8 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_138.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  psVar1 = local_d0;
  local_138._0_8_ = &local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"flattenedFunkyModel","");
  libcellml::NamedEntity::setName(psVar1);
  if ((long *)local_138._0_8_ != &local_128) {
    operator_delete((void *)local_138._0_8_,local_128 + 1);
  }
  libcellml::Validator::validateModel(local_f0);
  local_f8 = (long *)0x0;
  local_c0 = libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_138,"size_t(0)","validator->issueCount()",(unsigned_long *)&local_f8
             ,&local_c0);
  if ((Message)local_138.success_ == (Message)0x0) {
    testing::Message::Message((Message *)&local_f8);
    if (local_138.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_138.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x225,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c0,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c0);
    if (local_f8 != (long *)0x0) {
      cVar3 = testing::internal::IsTrue(true);
      if ((cVar3 != '\0') && (local_f8 != (long *)0x0)) {
        (**(code **)(*local_f8 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_138.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  if (local_c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c8);
  }
  if (local_e8.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8.ptr_);
  }
  if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
  }
  if ((long *)local_118._0_8_ != &local_108) {
    operator_delete((void *)local_118._0_8_,local_108 + 1);
  }
  if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
  }
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
  }
  if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
  }
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
  }
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b0);
  }
  return;
}

Assistant:

TEST(Importer, rangeOfValidSituations)
{
    // This is a test to figure out whether we need to restrict the library keys to absolute URLs, or
    // whether they could be any string.  This test creates a collection of models from different sources,
    // some which need imports, some not, and uses them to resolve imports on another model.
    auto parser = libcellml::Parser::create();

    // Parsing concrete units and components.
    auto concreteUnits = parser->parseModel(fileContents("importer/units_concrete.cellml"));
    EXPECT_EQ(size_t(0), parser->issueCount());

    auto concreteComponents = parser->parseModel(fileContents("importer/components_concrete.cellml"));
    EXPECT_EQ(size_t(0), parser->issueCount());

    // Parsing a model which imports components and units from files called units_source.cellml
    // and components_source.cellml respectively.  These "hidden" files will also be added to the importer
    // library when they're resolved.
    auto importedUnits = parser->parseModel(fileContents("importer/units_imported.cellml"));
    EXPECT_EQ(size_t(0), parser->issueCount());

    auto importedComponents = parser->parseModel(fileContents("importer/components_imported.cellml"));
    EXPECT_EQ(size_t(0), parser->issueCount());

    // Create models through the API. These don't need import resolution.
    auto localConcreteUnits = libcellml::Model::create("localConcreteUnits");
    localConcreteUnits->addUnits(libcellml::Units::create("units5"));

    // Add all the concrete models to the Importer. These don't need resolving as they have no imports of their own.
    auto importer = libcellml::Importer::create();
    importer->addModel(concreteUnits, "i_dont_exist_yet.cellml"); // add with key that's not a file (yet).
    importer->addModel(concreteComponents, "https://www.example.com/myComponents.cellml"); // add with a key that is a remote URL.

    // Add models which have imports to the Importer by resolving them. They are automatically saved into the
    // Importer's library, along with any dependencies, under the names used to resolve them.
    importer->resolveImports(importedUnits, resourcePath("importer/"));
    importer->resolveImports(importedComponents, resourcePath("importer/"));

    EXPECT_FALSE(importedUnits->hasUnresolvedImports());
    EXPECT_FALSE(importedComponents->hasUnresolvedImports());

    // Now create a funky model that imports from all over the place and see what happens.
    const std::string funkyString =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"funky\">\n"
        // Status quo functionality, key is relative URL + base file path as the relative URL doesn't exist as a key.
        "  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\"units_imported.cellml\">\n"
        "    <units units_ref=\"units1_imported\" name=\"units1FromLibrary\"/>\n"
        "  </import>\n"
        // Use the relative URL for a hidden child source component.
        "  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\"components_source.cellml\">\n"
        "    <component component_ref=\"component1\" name=\"component1FromLibrary\"/>\n"
        "  </import>\n"
        // Use the absolute URL for a hidden child source component.
        "  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\""
        + resourcePath("importer/components_source.cellml")
        + "\">\n"
          "    <component component_ref=\"component2\" name=\"component2FromLibrary\"/>\n"
          "  </import>\n"
          // Remote website URL used for key.
          "  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\"https://www.example.com/myComponents.cellml\">\n"
          "    <component component_ref=\"component3\" name=\"component3FromLibrary\"/>\n"
          "  </import>\n"
          // Currently non-existent file used for the key. For this CellML file to function outside of the
          // the Importer instance, this model needs to be written to this location.
          "  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\"i_dont_exist_yet.cellml\">\n"
          "    <units units_ref=\"units4\" name=\"units4FromLibrary\"/>\n"
          "  </import>\n"
          "</model>";

    auto funkyModel = parser->parseModel(funkyString);
    EXPECT_EQ(size_t(0), parser->issueCount());

    // Pass in a base file path, this will be used to resolve URLs if they don't already exist as keys.
    // This allows the model to be resolved against different locations where local files are specified.
    importer->resolveImports(funkyModel, resourcePath("importer/"));
    EXPECT_FALSE(funkyModel->hasUnresolvedImports());
    EXPECT_EQ(size_t(0), importer->issueCount());

    // Funky hrefs are valid ...
    auto validator = libcellml::Validator::create();
    validator->validateModel(funkyModel);
    EXPECT_EQ(size_t(0), validator->issueCount());

    // ... and can be flattened as expected too.
    auto flattenedFunkyModel = importer->flattenModel(funkyModel);
    EXPECT_EQ(size_t(0), importer->issueCount());

    flattenedFunkyModel->setName("flattenedFunkyModel");
    validator->validateModel(flattenedFunkyModel);
    EXPECT_EQ(size_t(0), validator->issueCount());
}